

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inifile.cpp
# Opt level: O0

string * trim(string *string)

{
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined8 local_a0;
  pointer_to_unary_function<int,_int> local_98;
  pointer_to_unary_function<int,_int> local_90;
  undefined1 local_88 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  undefined8 local_60;
  pointer_to_unary_function<int,_int> local_58;
  pointer_to_unary_function<int,_int> local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20 [2];
  string *string_local;
  
  string_local = string;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_20,&local_28);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  local_58 = std::ptr_fun<int,int>(isspace);
  local_50._M_ptr = (_func_int_int *)std::not1<std::pointer_to_unary_function<int,int>>(&local_58);
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                       (local_40,local_48,
                        (unary_negate<std::pointer_to_unary_function<int,_int>_>)local_50._M_ptr);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
  local_60 = std::__cxx11::string::erase(in_RSI,local_20[0],local_30);
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  local_98 = std::ptr_fun<int,int>(isspace);
  local_90._M_ptr = (_func_int_int *)std::not1<std::pointer_to_unary_function<int,int>>(&local_98);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            (&local_78,&local_80,(unary_negate<std::pointer_to_unary_function<int,_int>_>)local_88);
  local_70._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_78);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
  local_a8._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,&local_a8);
  std::__cxx11::string::erase(in_RSI,local_68,local_a0);
  std::__cxx11::string::string((string *)string,in_RSI);
  return string;
}

Assistant:

static inline std::string trim(std::string string)
{
    string.erase(string.begin(), std::find_if(string.begin(), string.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
    string.erase(std::find_if(string.rbegin(), string.rend(), std::not1(std::ptr_fun<int, int>(std::isspace))).base(), string.end());
    return string;
}